

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O2

void pcp_db_add_md(pcp_flow_t *f,uint16_t md_id,void *val,size_t val_len)

{
  uint uVar1;
  md_val_t *pmVar2;
  size_t __n;
  uint32_t uVar3;
  
  if (f == (pcp_flow_t *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                  ,0xed,"void pcp_db_add_md(pcp_flow_t *, uint16_t, void *, size_t)");
  }
  uVar3 = f->md_val_count;
  for (pmVar2 = f->md_vals;
      ((uVar3 != 0 && (pmVar2 != (md_val_t *)0x0)) && (pmVar2->md_id != md_id)); pmVar2 = pmVar2 + 1
      ) {
    uVar3 = uVar3 - 1;
  }
  if (pmVar2 == (md_val_t *)0x0 || uVar3 == 0) {
    pmVar2 = (md_val_t *)realloc(f->md_vals,(ulong)(f->md_val_count + 1) * 0x1c);
    if (pmVar2 == (md_val_t *)0x0) {
      return;
    }
    f->md_vals = pmVar2;
    uVar1 = f->md_val_count;
    f->md_val_count = uVar1 + 1;
    pmVar2 = pmVar2 + uVar1;
  }
  pmVar2->md_id = md_id;
  if (val == (void *)0x0 || val_len == 0) {
    pmVar2->val_len = 0;
    return;
  }
  __n = 0x18;
  if (val_len < 0x18) {
    __n = val_len;
  }
  pmVar2->val_len = (uint16_t)__n;
  memcpy(pmVar2->val_buf,val,__n);
  return;
}

Assistant:

void pcp_db_add_md(pcp_flow_t *f, uint16_t md_id, void *val, size_t val_len) {
    md_val_t *md;
    uint32_t i;

    assert(f);

    for (i = f->md_val_count, md = f->md_vals; i > 0 && md != NULL; --i, ++md) {
        if (md->md_id == md_id) {
            break;
        }
    }
    if (i == 0) {
        md = NULL;
    }

    if (!md) {
        md = (md_val_t *)realloc(f->md_vals,
                                 sizeof(f->md_vals[0]) * (f->md_val_count + 1));
        if (!md) { // LCOV_EXCL_START
            return;
        } // LCOV_EXCL_STOP
        f->md_vals = md;
        md = f->md_vals + f->md_val_count++;
    }
    md->md_id = md_id;
    if ((val_len > 0) && (val != NULL)) {
        md->val_len =
            val_len > sizeof(md->val_buf) ? sizeof(md->val_buf) : val_len;
        memcpy(md->val_buf, val, md->val_len);
    } else {
        md->val_len = 0;
    }
}